

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

void __thiscall icu_63::ICUNumberFormatService::ICUNumberFormatService(ICUNumberFormatService *this)

{
  ICUNumberFormatFactory *this_00;
  UnicodeString *dname;
  ICUNumberFormatFactory *local_90;
  undefined4 local_68 [2];
  UErrorCode status;
  ConstChar16Ptr local_58;
  UnicodeString local_50;
  ICUNumberFormatService *local_10;
  ICUNumberFormatService *this_local;
  
  local_10 = this;
  ConstChar16Ptr::ConstChar16Ptr(&local_58,L"Number Format");
  UnicodeString::UnicodeString(&local_50,'\x01',&local_58,-1);
  dname = &local_50;
  ICULocaleService::ICULocaleService(&this->super_ICULocaleService,dname);
  UnicodeString::~UnicodeString(&local_50);
  ConstChar16Ptr::~ConstChar16Ptr(&local_58);
  (this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier =
       (_func_int **)&PTR__ICUNumberFormatService_004fab70;
  local_68[0] = 0;
  this_00 = (ICUNumberFormatFactory *)UMemory::operator_new((UMemory *)0x90,(size_t)dname);
  local_90 = (ICUNumberFormatFactory *)0x0;
  if (this_00 != (ICUNumberFormatFactory *)0x0) {
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x28) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x30) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x18) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 0x20) = 0;
    *(undefined8 *)((long)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion + 8) = 0;
    (this_00->super_ICUResourceBundleFactory)._bundleName.fUnion.fFields.fArray = (char16_t *)0x0;
    (this_00->super_ICUResourceBundleFactory)._bundleName.super_Replaceable.super_UObject.
    _vptr_UObject = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_ICUResourceBundleFactory)._bundleName.fUnion = 0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x30) =
         0;
    *(undefined8 *)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._coverage = 0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x20) =
         0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x28) =
         0;
    (this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion.fFields.fArray =
         (char16_t *)0x0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 0x18) =
         0;
    *(undefined8 *)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion =
         0;
    *(undefined8 *)
     ((long)&(this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.fUnion + 8) = 0;
    (this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory.super_ICUServiceFactory.
    super_UObject._vptr_UObject = (_func_int **)0x0;
    (this_00->super_ICUResourceBundleFactory).super_LocaleKeyFactory._name.super_Replaceable.
    super_UObject._vptr_UObject = (_func_int **)0x0;
    ICUNumberFormatFactory::ICUNumberFormatFactory(this_00);
    local_90 = this_00;
  }
  (*(this->super_ICULocaleService).super_ICUService.super_ICUNotifier._vptr_ICUNotifier[9])
            (this,local_90,local_68);
  return;
}

Assistant:

ICUNumberFormatService()
        : ICULocaleService(UNICODE_STRING_SIMPLE("Number Format"))
    {
        UErrorCode status = U_ZERO_ERROR;
        registerFactory(new ICUNumberFormatFactory(), status);
    }